

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::eval_selection_vec4(ShaderEvalContext *c)

{
  Vector<float,_4> *v;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  Vector<float,_4> local_20;
  
  local_38.m_data[3] = c->in[1].m_data[0];
  local_38.m_data[2] = c->in[1].m_data[1];
  local_38.m_data[1] = c->in[1].m_data[2];
  local_38.m_data[0] = c->in[1].m_data[3];
  local_48.m_data[0] = c->in[2].m_data[0];
  local_48.m_data[3] = c->in[2].m_data[1];
  local_48.m_data[2] = c->in[2].m_data[2];
  local_48.m_data[1] = c->in[2].m_data[3];
  v = &local_48;
  if (0.0 < c->in[0].m_data[2]) {
    v = &local_38;
  }
  tcu::Vector<float,_4>::Vector(&local_20,v);
  *(undefined8 *)(c->color).m_data = local_20.m_data._0_8_;
  *(undefined8 *)((c->color).m_data + 2) = local_20.m_data._8_8_;
  return;
}

Assistant:

void eval_selection_vec4	(ShaderEvalContext& c) { c.color		= selection(c.in[0].z() > 0.0f,		c.in[1].swizzle(3, 2, 1, 0),	c.in[2].swizzle(0, 3, 2, 1)); }